

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O0

void __thiscall
cppnet::Dispatcher::Connect::anon_class_48_3_02cd77fa::operator()(anon_class_48_3_02cd77fa *this)

{
  Dispatcher *pDVar1;
  element_type *peVar2;
  shared_ptr<cppnet::CppNetBase> local_60;
  weak_ptr<cppnet::EventActions> local_50 [2];
  enable_shared_from_this<cppnet::Dispatcher> local_30;
  undefined1 local_20 [8];
  shared_ptr<cppnet::RWSocket> sock;
  anon_class_48_3_02cd77fa *this_local;
  
  pDVar1 = this->this;
  sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  MakeRWSocket();
  peVar2 = std::__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::enable_shared_from_this<cppnet::Dispatcher>::shared_from_this(&local_30);
  Socket::SetDispatcher(&peVar2->super_Socket,(shared_ptr<cppnet::Dispatcher> *)&local_30);
  std::shared_ptr<cppnet::Dispatcher>::~shared_ptr((shared_ptr<cppnet::Dispatcher> *)&local_30);
  peVar2 = std::__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::weak_ptr<cppnet::EventActions>::weak_ptr<cppnet::EventActions,void>
            (local_50,&pDVar1->_event_actions);
  Socket::SetEventActions(&peVar2->super_Socket,local_50);
  std::weak_ptr<cppnet::EventActions>::~weak_ptr(local_50);
  peVar2 = std::__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::weak_ptr<cppnet::CppNetBase>::lock((weak_ptr<cppnet::CppNetBase> *)&local_60);
  Socket::SetCppNetBase(&peVar2->super_Socket,&local_60);
  std::shared_ptr<cppnet::CppNetBase>::~shared_ptr(&local_60);
  peVar2 = std::__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  (*(peVar2->super_Socket)._vptr_Socket[9])(peVar2,this,(ulong)this->port);
  std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)local_20);
  return;
}

Assistant:

void Dispatcher::Connect(const std::string& ip, uint16_t port) {
    auto task = [ip, port, this]() {
        auto sock = MakeRWSocket();
        sock->SetDispatcher(shared_from_this());
        sock->SetEventActions(_event_actions);
        sock->SetCppNetBase(_cppnet_base.lock());
        sock->Connect(ip, port);
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}